

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

ForwardingTypedefSymbol *
slang::ast::ForwardingTypedefSymbol::fromSyntax
          (Scope *scope,ForwardTypedefDeclarationSyntax *syntax)

{
  Compilation *this;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  ForwardingTypedefSymbol *this_00;
  ForwardTypeRestriction typeRestriction;
  ForwardTypeRestriction local_44;
  SourceLocation local_40;
  string_view local_38;
  
  local_44 = None;
  if (syntax->typeRestriction != (ForwardTypeRestrictionSyntax *)0x0) {
    local_44 = SemanticFacts::getTypeRestriction(syntax->typeRestriction);
  }
  this = scope->compilation;
  local_38 = parsing::Token::valueText(&syntax->name);
  local_40 = parsing::Token::location(&syntax->name);
  this_00 = BumpAllocator::
            emplace<slang::ast::ForwardingTypedefSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ForwardTypeRestriction&>
                      (&this->super_BumpAllocator,&local_38,&local_40,&local_44);
  (this_00->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this_00->super_Symbol,scope,syntax_00);
  return this_00;
}

Assistant:

ForwardingTypedefSymbol& ForwardingTypedefSymbol::fromSyntax(
    const Scope& scope, const ForwardTypedefDeclarationSyntax& syntax) {

    auto typeRestriction = ForwardTypeRestriction::None;
    if (syntax.typeRestriction)
        typeRestriction = SemanticFacts::getTypeRestriction(*syntax.typeRestriction);

    auto& comp = scope.getCompilation();
    auto result = comp.emplace<ForwardingTypedefSymbol>(syntax.name.valueText(),
                                                        syntax.name.location(), typeRestriction);
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    return *result;
}